

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_CutDsdBalanceEval_rec
              (If_DsdMan_t *p,int Id,int *pTimes,int *pnSupp,Vec_Int_t *vAig,int *piLit,int nSuppAll
              ,int *pArea,char *pPermLits)

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  If_DsdObj_t *pObj;
  Vec_Int_t *vCover;
  uint fXor;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int aiStack_c0 [2];
  int pFaninLits [15];
  int pCounter [15];
  
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,Id);
  uVar4 = *(uint *)&pObj->field_0x4;
  switch(uVar4 & 7) {
  case 2:
    uVar4 = Abc_Lit2Var((int)pPermLits[*pnSupp]);
    if (vAig != (Vec_Int_t *)0x0) {
      iVar3 = Abc_LitIsCompl((int)pPermLits[*pnSupp]);
      iVar3 = Abc_Var2Lit(uVar4,iVar3);
      *piLit = iVar3;
    }
    *pnSupp = *pnSupp + 1;
    iVar3 = pTimes[uVar4];
    break;
  case 3:
  case 4:
    fXor = (uint)((uVar4 & 7) == 4);
    uVar10 = 0;
    uVar9 = 0;
    iVar3 = 0;
    while ((iVar2 = (int)uVar9, uVar10 < uVar4 >> 0x1b &&
           (iVar1 = If_DsdObjFaninLit(pObj,(int)uVar10), iVar1 != 0))) {
      iVar3 = Abc_Lit2Var(iVar1);
      piVar5 = pFaninLits + uVar10;
      iVar3 = If_CutDsdBalanceEval_rec(p,iVar3,pTimes,pnSupp,vAig,piVar5,nSuppAll,pArea,pPermLits);
      if (iVar3 == -1) {
        return -1;
      }
      if (vAig != (Vec_Int_t *)0x0) {
        aiStack_c0[1] = *piVar5;
        iVar1 = Abc_LitIsCompl(iVar1);
        iVar1 = Abc_LitNotCond(aiStack_c0[1],iVar1);
        *piVar5 = iVar1;
        pFaninLits[uVar9] = iVar1;
      }
      uVar4 = iVar2 + 1;
      pCounter[uVar9] = iVar3;
      if (0 < iVar2) {
        while (iVar3 = (int)uVar9, 0 < iVar3) {
          iVar2 = pCounter[uVar9];
          uVar8 = (ulong)(iVar3 - 1);
          iVar1 = pCounter[uVar8];
          if (iVar2 < iVar1) break;
          if (iVar1 < iVar2) {
            pCounter[uVar9] = iVar1;
            pCounter[uVar8] = iVar2;
            if (vAig != (Vec_Int_t *)0x0) {
              iVar2 = pFaninLits[uVar9];
              pFaninLits[uVar9] = pFaninLits[uVar8];
              pFaninLits[uVar8] = iVar2;
            }
            uVar9 = (ulong)(iVar3 - 1);
          }
          else {
            pCounter[uVar8] = iVar1 + 1;
            if (vAig != (Vec_Int_t *)0x0) {
              iVar3 = If_LogCreateAndXor(vAig,pFaninLits[uVar9],pFaninLits[uVar8],nSuppAll,fXor);
              pFaninLits[uVar8] = iVar3;
            }
            uVar4 = uVar4 - 1;
            uVar7 = uVar9;
            while( true ) {
              uVar6 = uVar7 + 1;
              iVar3 = (int)uVar9;
              uVar9 = uVar8;
              if ((int)uVar4 <= iVar3) break;
              pCounter[uVar7] = pCounter[uVar6];
              if (vAig != (Vec_Int_t *)0x0) {
                pFaninLits[uVar7] = pFaninLits[uVar6];
              }
              uVar9 = (ulong)(iVar3 + 1);
              uVar7 = uVar6;
            }
          }
        }
      }
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        __assert_fail("nTimes > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                      ,0x77,
                      "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                     );
      }
      iVar3 = (uint)(uVar4 != 1) + pCounter[0];
      uVar10 = uVar10 + 1;
      uVar4 = *(uint *)&pObj->field_0x4;
    }
    if (iVar2 == 0) {
      __assert_fail("nCounter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                    ,0x8fa,
                    "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                   );
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = (*(uint *)&pObj->field_0x4 >> 0x1b) + *pArea + -1;
    }
    else {
      for (; 1 < (long)uVar9; uVar9 = uVar9 - 1) {
        iVar2 = If_LogCreateAndXor(vAig,pFaninLits[uVar9 - 1],aiStack_c0[uVar9],nSuppAll,fXor);
        aiStack_c0[uVar9] = iVar2;
      }
      *piLit = pFaninLits[0];
    }
    break;
  case 5:
    lVar11 = 0;
    uVar9 = 0;
    while ((uVar9 < uVar4 >> 0x1b && (iVar3 = If_DsdObjFaninLit(pObj,(int)uVar9), iVar3 != 0))) {
      iVar2 = Abc_Lit2Var(iVar3);
      piVar5 = (int *)((long)pFaninLits + lVar11);
      iVar2 = If_CutDsdBalanceEval_rec(p,iVar2,pTimes,pnSupp,vAig,piVar5,nSuppAll,pArea,pPermLits);
      *(int *)((long)pCounter + lVar11) = iVar2;
      if (iVar2 == -1) {
        return -1;
      }
      if (vAig != (Vec_Int_t *)0x0) {
        iVar2 = *piVar5;
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(iVar2,iVar3);
        *piVar5 = iVar3;
      }
      uVar9 = uVar9 + 1;
      uVar4 = *(uint *)&pObj->field_0x4;
      lVar11 = lVar11 + 4;
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = *pArea + 3;
    }
    else {
      iVar3 = If_LogCreateMux(vAig,pFaninLits[0],pFaninLits[1],pFaninLits[2],nSuppAll);
      *piLit = iVar3;
    }
    if (pCounter[2] < pCounter[1]) {
      pCounter[2] = pCounter[1];
    }
    if (pCounter[2] < pCounter[0]) {
      pCounter[2] = pCounter[0];
    }
    iVar3 = pCounter[2] + 2;
    break;
  case 6:
    iVar3 = -1;
    p_00 = p->vIsops[uVar4 >> 0x1b];
    iVar2 = If_DsdObjTruthId(p,pObj);
    vCover = Vec_WecEntry(p_00,iVar2);
    if (vCover->nSize != 0) {
      lVar11 = 0;
      uVar9 = 0;
      while ((uVar9 < *(uint *)&pObj->field_0x4 >> 0x1b &&
             (iVar3 = If_DsdObjFaninLit(pObj,(int)uVar9), iVar3 != 0))) {
        iVar2 = Abc_Lit2Var(iVar3);
        piVar5 = (int *)((long)pFaninLits + lVar11);
        iVar2 = If_CutDsdBalanceEval_rec(p,iVar2,pTimes,pnSupp,vAig,piVar5,nSuppAll,pArea,pPermLits)
        ;
        *(int *)((long)pCounter + lVar11) = iVar2;
        if (iVar2 == -1) {
          return -1;
        }
        if (vAig != (Vec_Int_t *)0x0) {
          iVar2 = *piVar5;
          iVar3 = Abc_LitIsCompl(iVar3);
          iVar3 = Abc_LitNotCond(iVar2,iVar3);
          *piVar5 = iVar3;
        }
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 4;
      }
      iVar3 = If_CutSopBalanceEvalInt(vCover,pCounter,pFaninLits,vAig,piLit,nSuppAll,pArea);
    }
    break;
  default:
    __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                  ,0x8eb,
                  "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                 );
  }
  return iVar3;
}

Assistant:

int If_CutDsdBalanceEval_rec( If_DsdMan_t * p, int Id, int * pTimes, int * pnSupp, Vec_Int_t * vAig, int * piLit, int nSuppAll, int * pArea, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var( pPermLits[*pnSupp] );
        if ( vAig ) 
            *piLit = Abc_Var2Lit( iCutVar, Abc_LitIsCompl(pPermLits[*pnSupp]) );
        (*pnSupp)++;
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        int i, iFanin, Delays[3], pFaninLits[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        if ( vAig )
            *piLit = If_LogCreateMux( vAig, pFaninLits[0], pFaninLits[1], pFaninLits[2], nSuppAll );
        else
            *pArea += 3;
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        return If_CutSopBalanceEvalInt( vCover, Delays, pFaninLits, vAig, piLit, nSuppAll, pArea );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int fXorFunc = (If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delay == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
            Result = If_LogCounterAddAig( pCounter, &nCounter, pFaninLits, Delay, vAig ? pFaninLits[i] : -1, vAig, nSuppAll, fXor, fXorFunc );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        if ( vAig )
            *piLit = If_LogCreateAndXorMulti( vAig, pFaninLits, nCounter, nSuppAll, fXorFunc );
        else
            *pArea += (pObj->nFans - 1) * (1 + 2 * fXor);
        return Result;
    }
}